

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Exception.hpp
# Opt level: O0

void __thiscall uv::Exception::~Exception(Exception *this)

{
  Exception *this_local;
  
  *(undefined ***)this = &PTR__Exception_00108d70;
  std::__cxx11::string::~string((string *)&this->msg_);
  std::exception::~exception(&this->super_exception);
  return;
}

Assistant:

~Exception() throw() {}